

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void slang::ast::builtins::registerNonConstFuncs(Compilation *c)

{
  Type *__args_2;
  Type *__args_2_00;
  pointer *__ptr;
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  initializer_list<const_slang::ast::Type_*> __l_04;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_1f8;
  allocator_type local_1d1;
  undefined1 local_1d0 [16];
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_1c0;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_1a8;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_1a0;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_198;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_190;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_188;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_180;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_178;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_170;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_168;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_160;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_158;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_150;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_148;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_140;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_138;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_130;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_128;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_120;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_118;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_110;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_108;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_100;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_f8;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_f0;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_e8;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_e0;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_d8;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_d0;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_c8;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_c0;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_b8;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_b0;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_a8;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_a0;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_98;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_90;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_88;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_80;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_78;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_70;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_68;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_60;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_58;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_50;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_48;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_40;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_38;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> intArg;
  
  __args_2 = c->intType;
  __args_2_00 = Compilation::getUnsignedIntType(c);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1f8;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)__args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&intArg,__l,(allocator_type *)&local_1c0);
  Compilation::getType(c,TimeType);
  std::make_unique<slang::ast::NonConstantFunction,char_const(&)[6],slang::ast::Type_const&>
            ((char (*) [6])&local_1f8,(Type *)"$time");
  local_38._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_38);
  if ((Type *)local_38._M_head_impl != (Type *)0x0) {
    (**(code **)(*(long *)&(local_38._M_head_impl)->_vptr_SystemSubroutine + 8))();
  }
  local_38._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  Compilation::getUnsignedIntType(c);
  std::make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&>
            ((char (*) [7])&local_1f8,(Type *)"$stime");
  local_40._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_40);
  if (local_40._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_40._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_40._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  Compilation::getType(c,RealTimeType);
  std::make_unique<slang::ast::NonConstantFunction,char_const(&)[10],slang::ast::Type_const&>
            ((char (*) [10])&local_1f8,(Type *)"$realtime");
  local_48._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_48);
  if (local_48._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_48._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_48._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c0.
                        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [8])&local_1f8,(Type *)"$random",(int *)__args_2,&local_1c0);
  local_50._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_50);
  if (local_50._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_50._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_50._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c0.
                        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[9],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [9])&local_1f8,(Type *)"$urandom",(int *)__args_2_00,&local_1c0);
  local_58._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_58);
  if (local_58._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_58._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_58._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1d0._12_4_ = 1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_1c0;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)__args_2_00;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)__args_2_00;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_1f8,__l_00,&local_1d1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[15],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [15])local_1d0,(Type *)"$urandom_range",(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_1d0 + 0xc));
  local_60._M_head_impl = (SystemSubroutine *)local_1d0._0_8_;
  local_1d0[0] = '\0';
  local_1d0[1] = '\0';
  local_1d0[2] = '\0';
  local_1d0[3] = '\0';
  local_1d0[4] = '\0';
  local_1d0[5] = '\0';
  local_1d0[6] = '\0';
  local_1d0[7] = '\0';
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_60);
  if (local_60._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_60._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_60._M_head_impl = (SystemSubroutine *)0x0;
  if ((char  [8])local_1d0._0_8_ != (char  [8])0x0) {
    (**(code **)(*(long *)local_1d0._0_8_ + 8))();
  }
  local_1d0[0] = '\0';
  local_1d0[1] = '\0';
  local_1d0[2] = '\0';
  local_1d0[3] = '\0';
  local_1d0[4] = '\0';
  local_1d0[5] = '\0';
  local_1d0[6] = '\0';
  local_1d0[7] = '\0';
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_1f8);
  local_1d0._12_4_ = 1;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)c->stringType;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_1c0;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_1c0.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_1f8,__l_01,&local_1d1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [7])local_1d0,(Type *)"$fopen",(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_1d0 + 0xc));
  local_68._M_head_impl = (SystemSubroutine *)local_1d0._0_8_;
  local_1d0[0] = '\0';
  local_1d0[1] = '\0';
  local_1d0[2] = '\0';
  local_1d0[3] = '\0';
  local_1d0[4] = '\0';
  local_1d0[5] = '\0';
  local_1d0[6] = '\0';
  local_1d0[7] = '\0';
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_68);
  if (local_68._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_68._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_68._M_head_impl = (SystemSubroutine *)0x0;
  if ((char  [8])local_1d0._0_8_ != (char  [8])0x0) {
    (**(code **)(*(long *)local_1d0._0_8_ + 8))();
  }
  local_1d0[0] = '\0';
  local_1d0[1] = '\0';
  local_1d0[2] = '\0';
  local_1d0[3] = '\0';
  local_1d0[4] = '\0';
  local_1d0[5] = '\0';
  local_1d0[6] = '\0';
  local_1d0[7] = '\0';
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_1f8);
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [8])&local_1f8,(Type *)"$fclose",(int *)c->voidType,&local_1c0);
  local_70._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_70);
  if (local_70._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_70._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_70._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [7])&local_1f8,(Type *)"$fgetc",(int *)__args_2,&local_1c0);
  local_78._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_78);
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_78._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1d0._12_4_ = 2;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_1c0;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)__args_2;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)__args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_1f8,__l_02,&local_1d1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [8])local_1d0,(Type *)"$ungetc",(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_1d0 + 0xc));
  local_80._M_head_impl = (SystemSubroutine *)local_1d0._0_8_;
  local_1d0[0] = '\0';
  local_1d0[1] = '\0';
  local_1d0[2] = '\0';
  local_1d0[3] = '\0';
  local_1d0[4] = '\0';
  local_1d0[5] = '\0';
  local_1d0[6] = '\0';
  local_1d0[7] = '\0';
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_80);
  if ((char  [8])local_80._M_head_impl != (char  [8])0x0) {
    (*(local_80._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_80._M_head_impl = (SystemSubroutine *)0x0;
  if ((char  [8])local_1d0._0_8_ != (char  [8])0x0) {
    (**(code **)(*(long *)local_1d0._0_8_ + 8))();
  }
  local_1d0[0] = '\0';
  local_1d0[1] = '\0';
  local_1d0[2] = '\0';
  local_1d0[3] = '\0';
  local_1d0[4] = '\0';
  local_1d0[5] = '\0';
  local_1d0[6] = '\0';
  local_1d0[7] = '\0';
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_1f8);
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [7])&local_1f8,(Type *)"$ftell",(int *)__args_2,&local_1c0);
  local_88._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_88);
  if (local_88._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_88._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_88._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1d0._12_4_ = 3;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_1c0;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)__args_2;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)__args_2;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_1f8,__l_03,&local_1d1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[7],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [7])local_1d0,(Type *)"$fseek",(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_1d0 + 0xc));
  local_90._M_head_impl = (SystemSubroutine *)local_1d0._0_8_;
  local_1d0[0] = '\0';
  local_1d0[1] = '\0';
  local_1d0[2] = '\0';
  local_1d0[3] = '\0';
  local_1d0[4] = '\0';
  local_1d0[5] = '\0';
  local_1d0[6] = '\0';
  local_1d0[7] = '\0';
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_90);
  if ((char  [8])local_90._M_head_impl != (char  [8])0x0) {
    (*(local_90._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_90._M_head_impl = (SystemSubroutine *)0x0;
  if ((char  [8])local_1d0._0_8_ != (char  [8])0x0) {
    (**(code **)(*(long *)local_1d0._0_8_ + 8))();
  }
  local_1d0[0] = '\0';
  local_1d0[1] = '\0';
  local_1d0[2] = '\0';
  local_1d0[3] = '\0';
  local_1d0[4] = '\0';
  local_1d0[5] = '\0';
  local_1d0[6] = '\0';
  local_1d0[7] = '\0';
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_1f8);
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [8])&local_1f8,(Type *)"$rewind",(int *)__args_2,&local_1c0);
  local_98._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_98);
  if (local_98._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_98._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_98._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c0.
                        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[8],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [8])&local_1f8,(Type *)"$fflush",(int *)c->voidType,&local_1c0);
  local_a0._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_a0);
  if (local_a0._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_a0._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_a0._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[6],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>&>
            ((char (*) [6])&local_1f8,(Type *)"$feof",(int *)__args_2,&local_1c0);
  local_a8._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_a8);
  if (local_a8._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_a8._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_a8._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1d0._12_4_ = 1;
  local_1d0._0_8_ = c->stringType;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)local_1d0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_1f8,__l_04,&local_1d1);
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[15],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((char (*) [15])&local_1c0,(Type *)"$test$plusargs",(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_1d0 + 0xc));
  local_b0._M_head_impl =
       (SystemSubroutine *)
       local_1c0.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_b0);
  if (local_b0._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_b0._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_b0._M_head_impl = (SystemSubroutine *)0x0;
  if (local_1c0.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)((*local_1c0.
                 super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_1f8);
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[14],int>
            ((char (*) [14])&local_1f8,(int *)"$dist_uniform");
  local_b8._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_b8);
  if (local_b8._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_b8._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_b8._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[13],int>
            ((char (*) [13])&local_1f8,(int *)"$dist_normal");
  local_c0._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_c0);
  if (local_c0._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_c0._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_c0._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[18],int>
            ((char (*) [18])&local_1f8,(int *)"$dist_exponential");
  local_c8._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_c8);
  if (local_c8._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_c8._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_c8._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[14],int>
            ((char (*) [14])&local_1f8,(int *)"$dist_poisson");
  local_d0._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_d0);
  if (local_d0._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_d0._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_d0._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[17],int>
            ((char (*) [17])&local_1f8,(int *)"$dist_chi_square");
  local_d8._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_d8);
  if (local_d8._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_d8._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_d8._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[8],int>
            ((char (*) [8])&local_1f8,(int *)"$dist_t");
  local_e0._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_e0);
  if (local_e0._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_e0._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_e0._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  std::make_unique<slang::ast::builtins::DistributionFunc,char_const(&)[13],int>
            ((char (*) [13])&local_1f8,(int *)"$dist_erlang");
  local_e8._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_e8);
  if (local_e8._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_e8._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_e8._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::ValueChangeFunc,char_const(&)[6]>((char (*) [6])&local_1f8)
  ;
  local_f0._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_f0);
  if (local_f0._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_f0._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_f0._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::ValueChangeFunc,char_const(&)[6]>((char (*) [6])&local_1f8)
  ;
  local_f8._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_f8);
  if (local_f8._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_f8._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len)
              ();
  }
  local_f8._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::ValueChangeFunc,char_const(&)[8]>((char (*) [8])&local_1f8)
  ;
  local_100._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_100);
  if (local_100._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_100._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_100._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::ValueChangeFunc,char_const(&)[9]>((char (*) [9])&local_1f8)
  ;
  local_108._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_108);
  if (local_108._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_108._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_108._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c0.
                        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[11],bool>
            ((char (*) [11])&local_1f8,(bool *)"$past_gclk");
  local_110._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_110);
  if (local_110._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_110._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_110._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c0.
                        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[11],bool>
            ((char (*) [11])&local_1f8,(bool *)"$rose_gclk");
  local_118._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_118);
  if (local_118._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_118._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_118._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c0.
                        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[11],bool>
            ((char (*) [11])&local_1f8,(bool *)"$fell_gclk");
  local_120._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_120);
  if (local_120._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_120._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_120._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c0.
                        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[13],bool>
            ((char (*) [13])&local_1f8,(bool *)"$stable_gclk");
  local_128._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_128);
  if (local_128._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_128._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_128._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c0.
                        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[14],bool>
            ((char (*) [14])&local_1f8,(bool *)"$changed_gclk");
  local_130._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_130);
  if (local_130._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_130._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_130._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[13],bool>
            ((char (*) [13])&local_1f8,(bool *)"$future_gclk");
  local_138._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_138);
  if (local_138._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_138._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_138._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[13],bool>
            ((char (*) [13])&local_1f8,(bool *)"$rising_gclk");
  local_140._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_140);
  if (local_140._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_140._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_140._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[14],bool>
            ((char (*) [14])&local_1f8,(bool *)"$falling_gclk");
  local_148._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_148);
  if (local_148._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_148._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_148._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[13],bool>
            ((char (*) [13])&local_1f8,(bool *)"$steady_gclk");
  local_150._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_150);
  if (local_150._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_150._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_150._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  std::make_unique<slang::ast::builtins::GlobalValueChangeFunc,char_const(&)[15],bool>
            ((char (*) [15])&local_1f8,(bool *)"$changing_gclk");
  local_158._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_158);
  if (local_158._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_158._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_158._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::FErrorFunc>();
  local_160._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_160);
  if (local_160._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_160._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_160._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::FGetsFunc>();
  local_168._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_168);
  if (local_168._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_168._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_168._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_1c0.
                         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  std::make_unique<slang::ast::builtins::ScanfFunc,bool>((bool *)&local_1f8);
  local_170._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_170);
  if (local_170._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_170._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_170._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1c0.
                        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::make_unique<slang::ast::builtins::ScanfFunc,bool>((bool *)&local_1f8);
  local_178._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_178);
  if (local_178._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_178._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_178._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::FReadFunc>();
  local_180._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_180);
  if (local_180._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_180._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_180._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::SampledFunc>();
  local_188._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_188);
  if (local_188._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_188._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_188._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::PastFunc>();
  local_190._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_190);
  if (local_190._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_190._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_190._M_head_impl = (SystemSubroutine *)0x0;
  if (local_1f8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)((*local_1f8._M_impl.super__Vector_impl_data._M_start)->super_Symbol).name._M_len)();
  }
  local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffff00000000;
  local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0[0xc] = 1;
  std::
  make_unique<slang::ast::NonConstantFunction,char_const(&)[10],slang::ast::Type_const&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>,bool>
            ((char (*) [10])&local_1c0,(Type *)"triggered",(int *)c->bitType,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_1d0,(bool *)&local_1f8);
  local_198._M_head_impl =
       (SystemSubroutine *)
       local_1c0.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemMethod
            (c,EventType,
             (unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
              *)&local_198);
  if (local_198._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_198._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_198._M_head_impl = (SystemSubroutine *)0x0;
  if (local_1c0.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)((*local_1c0.
                 super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_Symbol).name._M_len)();
  }
  local_1c0.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_1f8);
  std::make_unique<slang::ast::builtins::RandModeFunc,char_const(&)[10]>((char (*) [10])&local_1f8);
  local_1a0._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemMethod
            (c,ClassProperty,
             (unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
              *)&local_1a0);
  if (local_1a0._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_1a0._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_1a0._M_head_impl = (SystemSubroutine *)0x0;
  if ((SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start !=
      (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)*(_func_int ***)local_1f8._M_impl.super__Vector_impl_data._M_start)->
              super_Symbol).name._M_len)();
  }
  std::make_unique<slang::ast::builtins::RandModeFunc,char_const(&)[16]>((char (*) [16])&local_1f8);
  local_1a8._M_head_impl = (SystemSubroutine *)local_1f8._M_impl.super__Vector_impl_data._M_start;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Compilation::addSystemMethod
            (c,ConstraintBlock,
             (unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
              *)&local_1a8);
  if (local_1a8._M_head_impl != (SystemSubroutine *)0x0) {
    (*(code *)(((Type *)(local_1a8._M_head_impl)->_vptr_SystemSubroutine)->super_Symbol).name._M_len
    )();
  }
  local_1a8._M_head_impl = (SystemSubroutine *)0x0;
  if (local_1f8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)((*local_1f8._M_impl.super__Vector_impl_data._M_start)->super_Symbol).name._M_len)();
  }
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&intArg.
                 super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               );
  return;
}

Assistant:

void registerNonConstFuncs(Compilation& c) {
#define REGISTER(...) c.addSystemSubroutine(std::make_unique<NonConstantFunction>(__VA_ARGS__))

    auto& intType = c.getIntType();
    auto& uintType = c.getUnsignedIntType();
    std::vector<const Type*> intArg = {&intType};

    REGISTER("$time", c.getType(SyntaxKind::TimeType));
    REGISTER("$stime", c.getUnsignedIntType());
    REGISTER("$realtime", c.getType(SyntaxKind::RealTimeType));
    REGISTER("$random", intType, 0, intArg);
    REGISTER("$urandom", uintType, 0, intArg);
    REGISTER("$urandom_range", uintType, 1, std::vector<const Type*>{&uintType, &uintType});

    REGISTER("$fopen", intType, 1, std::vector{&c.getStringType(), &c.getStringType()});
    REGISTER("$fclose", c.getVoidType(), 1, intArg);
    REGISTER("$fgetc", intType, 1, intArg);
    REGISTER("$ungetc", intType, 2, std::vector{&intType, &intType});
    REGISTER("$ftell", intType, 1, intArg);
    REGISTER("$fseek", intType, 3, std::vector{&intType, &intType, &intType});
    REGISTER("$rewind", intType, 1, intArg);
    REGISTER("$fflush", c.getVoidType(), 0, intArg);
    REGISTER("$feof", intType, 1, intArg);

    REGISTER("$test$plusargs", intType, 1, std::vector{&c.getStringType()});

#undef REGISTER

#define FUNC(name, numArgs) c.addSystemSubroutine(std::make_unique<DistributionFunc>(name, numArgs))
    FUNC("$dist_uniform", 3);
    FUNC("$dist_normal", 3);
    FUNC("$dist_exponential", 2);
    FUNC("$dist_poisson", 2);
    FUNC("$dist_chi_square", 2);
    FUNC("$dist_t", 2);
    FUNC("$dist_erlang", 3);
#undef FUNC

#define FUNC(name) c.addSystemSubroutine(std::make_unique<ValueChangeFunc>(name))
    FUNC("$rose");
    FUNC("$fell");
    FUNC("$stable");
    FUNC("$changed");
#undef FUNC

#define FUNC(name, isFuture) \
    c.addSystemSubroutine(std::make_unique<GlobalValueChangeFunc>(name, isFuture))
    FUNC("$past_gclk", false);
    FUNC("$rose_gclk", false);
    FUNC("$fell_gclk", false);
    FUNC("$stable_gclk", false);
    FUNC("$changed_gclk", false);
    FUNC("$future_gclk", true);
    FUNC("$rising_gclk", true);
    FUNC("$falling_gclk", true);
    FUNC("$steady_gclk", true);
    FUNC("$changing_gclk", true);
#undef FUNC

    c.addSystemSubroutine(std::make_unique<FErrorFunc>());
    c.addSystemSubroutine(std::make_unique<FGetsFunc>());
    c.addSystemSubroutine(std::make_unique<ScanfFunc>(true));
    c.addSystemSubroutine(std::make_unique<ScanfFunc>(false));
    c.addSystemSubroutine(std::make_unique<FReadFunc>());
    c.addSystemSubroutine(std::make_unique<SampledFunc>());
    c.addSystemSubroutine(std::make_unique<PastFunc>());

    c.addSystemMethod(SymbolKind::EventType,
                      std::make_unique<NonConstantFunction>("triggered", c.getBitType(), 0,
                                                            std::vector<const Type*>{},
                                                            /* isMethod */ true));

    c.addSystemMethod(SymbolKind::ClassProperty, std::make_unique<RandModeFunc>("rand_mode"));
    c.addSystemMethod(SymbolKind::ConstraintBlock,
                      std::make_unique<RandModeFunc>("constraint_mode"));
}